

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

uniformUVecFunctionPointer __thiscall
gl4cts::GPUShaderFP64Test10::getUniformFunctionForUVec
          (GPUShaderFP64Test10 *this,GLuint argument,functionObject *function_object)

{
  int iVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *this_00;
  Functions *gl;
  _variable_type argument_type;
  functionObject *function_object_local;
  GLuint argument_local;
  GPUShaderFP64Test10 *this_local;
  
  iVar1 = (*function_object->_vptr_functionObject[4])(function_object,(ulong)argument);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  if (iVar1 == 0x20) {
    return *(uniformUVecFunctionPointer *)(CONCAT44(extraout_var,iVar2) + 0x1548);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Not implemented",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
             ,0x38a1);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

GPUShaderFP64Test10::uniformUVecFunctionPointer GPUShaderFP64Test10::getUniformFunctionForUVec(
	glw::GLuint argument, const functionObject& function_object) const
{
	const Utils::_variable_type argument_type = function_object.getArgumentType(argument);
	const glw::Functions&		gl			  = m_context.getRenderContext().getFunctions();

	switch (argument_type)
	{
	case Utils::VARIABLE_TYPE_UVEC2:
		return gl.uniform2uiv;
		break;
	default:
		TCU_FAIL("Not implemented");
		break;
	}

	return 0;
}